

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmFuncts.cpp
# Opt level: O1

int AsmFuncts::getType(string *op)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int in_ECX;
  size_type *psVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  string local_50;
  
  bVar8 = false;
  Conversion::decToBin_abi_cxx11_(&local_50,(Conversion *)0x0,6,in_ECX);
  sVar1 = op->_M_string_length;
  if (sVar1 == local_50._M_string_length) {
    if (sVar1 == 0) {
      bVar8 = true;
    }
    else {
      iVar2 = bcmp((op->_M_dataplus)._M_p,local_50._M_dataplus._M_p,sVar1);
      bVar8 = iVar2 == 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  iVar2 = 1;
  if (!bVar8) {
    bVar8 = (long)Codes::typeROp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)Codes::typeROp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0;
    if (bVar8) {
      uVar7 = (long)Codes::typeROp_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)Codes::typeROp_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
      sVar1 = op->_M_string_length;
      psVar5 = &((Codes::typeROp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first)._M_string_length;
      uVar6 = 1;
      do {
        if ((sVar1 == *psVar5) &&
           ((sVar1 == 0 ||
            (iVar2 = bcmp((op->_M_dataplus)._M_p,
                          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (psVar5 + -1))->_M_dataplus)._M_p,sVar1), iVar2 == 0)))) {
          if (bVar8) {
            return 1;
          }
          break;
        }
        bVar8 = uVar6 < uVar7;
        psVar5 = psVar5 + 8;
        lVar4 = uVar6 + 1;
        uVar6 = uVar6 + 1;
      } while (lVar4 + (-(ulong)(uVar7 == 0) - uVar7) != 1);
    }
    bVar8 = (long)Codes::typeIOp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)Codes::typeIOp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0;
    if (bVar8) {
      uVar7 = (long)Codes::typeIOp_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)Codes::typeIOp_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
      sVar1 = op->_M_string_length;
      psVar5 = &((Codes::typeIOp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->second)._M_string_length;
      uVar6 = 1;
      do {
        if (((sVar1 == psVar5[-4]) &&
            ((iVar2 = 2, sVar1 == 0 ||
             (iVar3 = bcmp((op->_M_dataplus)._M_p,(void *)psVar5[-5],sVar1), iVar3 == 0)))) ||
           ((sVar1 == *psVar5 &&
            ((iVar2 = 2, sVar1 == 0 ||
             (iVar3 = bcmp((op->_M_dataplus)._M_p,
                           (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (psVar5 + -1))->_M_dataplus)._M_p,sVar1), iVar3 == 0))))))
        goto LAB_00125d3f;
        bVar8 = uVar6 < uVar7;
        psVar5 = psVar5 + 8;
        lVar4 = (-(ulong)(uVar7 == 0) - uVar7) + uVar6;
        uVar6 = uVar6 + 1;
      } while (lVar4 != 0);
    }
    iVar2 = 1;
LAB_00125d3f:
    if (!bVar8) {
      if ((long)Codes::typeJOp_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)Codes::typeJOp_abi_cxx11_.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        lVar4 = (long)Codes::typeJOp_abi_cxx11_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)Codes::typeJOp_abi_cxx11_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6;
        sVar1 = op->_M_string_length;
        lVar4 = lVar4 + (ulong)(lVar4 == 0);
        psVar5 = &((Codes::typeJOp_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second)._M_string_length;
        do {
          if (sVar1 == psVar5[-4]) {
            if (sVar1 == 0) {
              return 3;
            }
            iVar2 = bcmp((op->_M_dataplus)._M_p,(void *)psVar5[-5],sVar1);
            if (iVar2 == 0) {
              return 3;
            }
          }
          if (sVar1 == *psVar5) {
            if (sVar1 == 0) {
              return 3;
            }
            iVar2 = bcmp((op->_M_dataplus)._M_p,
                         (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (psVar5 + -1))->_M_dataplus)._M_p,sVar1);
            if (iVar2 == 0) {
              return 3;
            }
          }
          psVar5 = psVar5 + 8;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int AsmFuncts::getType(string op){
    if(op == Conversion::decToBin(0,6))
        return TYPE_R;
    for (int i = 0; i < Codes::typeROp.size(); i++)
        if((op == Codes::typeROp[i].first))
            return TYPE_R;

    for (int i = 0; i < Codes::typeIOp.size(); i++)
        if((op == Codes::typeIOp[i].first) || (op == Codes::typeIOp[i].second))
            return TYPE_I;

    for (int i = 0; i < Codes::typeJOp.size(); i++)
        if((op == Codes::typeJOp[i].first) || (op == Codes::typeJOp[i].second))
            return TYPE_J;
    return -1;
}